

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack16_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  *out = (ushort)*in + base;
  out[1] = *(ushort *)((long)in + 2) + base;
  out[2] = (ushort)in[1] + base;
  out[3] = *(ushort *)((long)in + 6) + base;
  out[4] = (ushort)in[2] + base;
  out[5] = *(ushort *)((long)in + 10) + base;
  out[6] = (ushort)in[3] + base;
  out[7] = *(ushort *)((long)in + 0xe) + base;
  return in + 4;
}

Assistant:

uint32_t * unpack16_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 16 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 16 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 16 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 16 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}